

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Def * __thiscall hdc::Parser::parse_def(Parser *this)

{
  bool bVar1;
  Def *this_00;
  reference pTVar2;
  Type *pTVar3;
  CompoundStatement *statements;
  Type *ptype;
  Token name;
  Def *def;
  Parser *this_local;
  
  this_00 = (Def *)operator_new(0xb8);
  Def::Def(this_00);
  expect(this,TK_DEF);
  expect(this,TK_ID);
  pTVar2 = __gnu_cxx::
           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
           operator*(&this->matched);
  Token::Token((Token *)&name.field_0x28,pTVar2);
  Def::setName(this_00,(Token *)&name.field_0x28);
  Token::~Token((Token *)&name.field_0x28);
  expect(this,TK_COLON);
  pTVar3 = parse_type(this);
  Def::setReturnType(this_00,pTVar3);
  expect(this,TK_NEWLINE);
  expect(this,TK_BEGIN);
  while( true ) {
    bVar1 = hasParameters(this);
    if (!bVar1) break;
    match(this,TK_AT);
    Token::Token((Token *)&ptype);
    expect(this,TK_ID);
    pTVar2 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    Token::operator=((Token *)&ptype,pTVar2);
    expect(this,TK_COLON);
    pTVar3 = parse_type(this);
    expect(this,TK_NEWLINE);
    Def::addParameter(this_00,(Token *)&ptype,pTVar3);
    Token::~Token((Token *)&ptype);
  }
  statements = parse_statements(this);
  Def::setStatements(this_00,statements);
  expect(this,TK_END);
  return this_00;
}

Assistant:

Def* Parser::parse_def() {
    Def* def = new Def();

    expect(TK_DEF);
    expect(TK_ID);

    def->setName(*matched);

    expect(TK_COLON);
    def->setReturnType(parse_type());

    expect(TK_NEWLINE);
    expect(TK_BEGIN);

    while (hasParameters()) {
    //while (match(TK_AT)) {
        match(TK_AT);
        Token name;
        Type* ptype;

        expect(TK_ID);
        name = *matched;

        expect(TK_COLON);
        ptype = parse_type();
        expect(TK_NEWLINE);

        def->addParameter(name, ptype);
    }

    def->setStatements(parse_statements());
    expect(TK_END);

    return def;
}